

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O1

void __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
::SingleFileIndexedStorage
          (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
           *this,path *storageFilePath,shared_ptr<supermap::io::FileManager> *fileManager,
          InnerRegisterSupplier *registerSupplier)

{
  _Manager_type p_Var1;
  element_type *peVar2;
  FileManager *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 local_49;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = registerSupplier->_M_invoker;
  p_Var1 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var1;
  }
  OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>::
  OrderedStorage((OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
                  *)this,(InnerRegisterSupplier *)&local_48);
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>.
  _vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00204f70;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>.
  _vptr_OrderedStorage = (_func_int **)&PTR_append_00204f30;
  (this->storageFile_).super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<supermap::io::TemporaryFile,std::allocator<supermap::io::TemporaryFile>,std::filesystem::__cxx11::path_const&,std::shared_ptr<supermap::io::FileManager>>
            (&(this->storageFile_).
              super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(TemporaryFile **)&this->storageFile_,
             (allocator<supermap::io::TemporaryFile> *)&local_49,storageFilePath,fileManager);
  peVar2 = (this->storageFile_).
           super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar2->manager_).
            super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (peVar2->manager_).
            super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  io::FileManager::create(this_00,storageFilePath);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

explicit SingleFileIndexedStorage(const std::filesystem::path &storageFilePath,
                                      std::shared_ptr<io::FileManager> fileManager,
                                      InnerRegisterSupplier registerSupplier)
        : IndexedStorage<T, IndexT, RegisterInfo>(std::move(registerSupplier)),
          storageFile_(std::make_shared<io::TemporaryFile>(storageFilePath, std::move(fileManager))) {
        storageFile_->getFileManager()->create(storageFilePath);
    }